

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Restaurant.cpp
# Opt level: O2

void __thiscall Restaurant::~Restaurant(Restaurant *this)

{
  pointer ppTVar1;
  pointer ppBVar2;
  BaseAction **j;
  pointer ppBVar3;
  Table **table;
  pointer ppTVar4;
  
  this->_vptr_Restaurant = (_func_int **)&PTR__Restaurant_0010fd88;
  ppTVar1 = (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar4 = (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppTVar4 != ppTVar1; ppTVar4 = ppTVar4 + 1) {
    if (*ppTVar4 != (Table *)0x0) {
      (*(*ppTVar4)->_vptr_Table[1])();
    }
  }
  ppBVar2 = (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppBVar3 = (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppBVar3 != ppBVar2; ppBVar3 = ppBVar3 + 1
      ) {
    if (*ppBVar3 != (BaseAction *)0x0) {
      (*(*ppBVar3)->_vptr_BaseAction[4])();
    }
  }
  ppTVar4 = (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppTVar4) {
    (this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppTVar4;
  }
  ppBVar3 = (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar3) {
    (this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppBVar3;
  }
  std::vector<Dish,_std::allocator<Dish>_>::clear(&this->menu);
  std::__cxx11::string::~string((string *)&this->newMsg);
  std::_Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>::~_Vector_base
            (&(this->actionsLog).super__Vector_base<BaseAction_*,_std::allocator<BaseAction_*>_>);
  std::vector<Dish,_std::allocator<Dish>_>::~vector(&this->menu);
  std::_Vector_base<Table_*,_std::allocator<Table_*>_>::~_Vector_base
            (&(this->tables).super__Vector_base<Table_*,_std::allocator<Table_*>_>);
  return;
}

Assistant:

Restaurant::~Restaurant()
{
    for (auto &table : tables) {
        delete table;
    }
    for (auto &j : actionsLog) {
        delete j;
    }
    tables.clear();
    actionsLog.clear();
    menu.clear();
}